

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Icon.cxx
# Opt level: O3

void __thiscall Fl_File_Icon::~Fl_File_Icon(Fl_File_Icon *this)

{
  Fl_File_Icon **ppFVar1;
  Fl_File_Icon *pFVar2;
  Fl_File_Icon *pFVar3;
  
  ppFVar1 = &first_;
  pFVar3 = (Fl_File_Icon *)0x0;
  do {
    pFVar2 = pFVar3;
    ppFVar1 = &((Fl_File_Icon *)ppFVar1)->next_->next_;
    if ((Fl_File_Icon *)ppFVar1 == this) break;
    pFVar3 = (Fl_File_Icon *)ppFVar1;
  } while ((Fl_File_Icon *)ppFVar1 != (Fl_File_Icon *)0x0);
  if ((Fl_File_Icon *)ppFVar1 != (Fl_File_Icon *)0x0) {
    pFVar3 = (Fl_File_Icon *)&first_;
    if (pFVar2 != (Fl_File_Icon *)0x0) {
      pFVar3 = pFVar2;
    }
    pFVar3->next_ = ((Fl_File_Icon *)ppFVar1)->next_;
  }
  if (this->alloc_data_ != 0) {
    free(this->data_);
    return;
  }
  return;
}

Assistant:

Fl_File_Icon::~Fl_File_Icon() {
  Fl_File_Icon	*current,	// Current icon in list
		*prev;		// Previous icon in list


  // Find the icon in the list...
  for (current = first_, prev = (Fl_File_Icon *)0;
       current != this && current != (Fl_File_Icon *)0;
       prev = current, current = current->next_) {/*empty*/}

  // Remove the icon from the list as needed...
  if (current)
  {
    if (prev)
      prev->next_ = current->next_;
    else
      first_ = current->next_;
  }

  // Free any memory used...
  if (alloc_data_)
    free(data_);
}